

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.hpp
# Opt level: O0

void __thiscall libtorrent::encryption_handler::~encryption_handler(encryption_handler *this)

{
  encryption_handler *this_local;
  
  std::shared_ptr<libtorrent::crypto_plugin>::~shared_ptr(&this->m_dec_handler);
  std::__cxx11::
  list<libtorrent::encryption_handler::barrier,_std::allocator<libtorrent::encryption_handler::barrier>_>
  ::~list(&this->m_send_barriers);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT encryption_handler
	{
		std::tuple<int, span<span<char const>>>
		encrypt(span<span<char>> iovec);

		int decrypt(crypto_receive_buffer& recv_buffer
			, std::size_t& bytes_transferred);

		bool switch_send_crypto(std::shared_ptr<crypto_plugin> crypto
			, int pending_encryption);

		void switch_recv_crypto(std::shared_ptr<crypto_plugin> crypto
			, crypto_receive_buffer& recv_buffer);

		bool is_send_plaintext() const
		{
			return m_send_barriers.empty() || m_send_barriers.back().next != INT_MAX;
		}

		bool is_recv_plaintext() const
		{
			return m_dec_handler.get() == nullptr;
		}

	private:
		struct barrier
		{
			barrier(std::shared_ptr<crypto_plugin> plugin, int n)
				: enc_handler(plugin), next(n) {}
			std::shared_ptr<crypto_plugin> enc_handler;
			// number of bytes to next barrier
			int next;
		};
		std::list<barrier> m_send_barriers;
		std::shared_ptr<crypto_plugin> m_dec_handler;
	}